

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,true,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  uint64_t uVar5;
  long lVar6;
  sel_t *psVar7;
  bool bVar8;
  idx_t iVar9;
  ulong uVar10;
  sel_t sVar11;
  long lVar12;
  int64_t *piVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  
  if (count + 0x3f < 0x40) {
    iVar9 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar9 = 0;
    lVar12 = 0;
    uVar16 = 0;
    uVar15 = 0;
    do {
      uVar10 = uVar16;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar17 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar17 = count;
        }
LAB_014549f3:
        if (uVar16 < uVar17) {
          psVar3 = sel->sel_vector;
          uVar5 = rdata->lower;
          lVar6 = rdata->upper;
          psVar4 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          piVar13 = &ldata[uVar16].upper;
          do {
            uVar10 = uVar16;
            if (psVar3 != (sel_t *)0x0) {
              uVar10 = (ulong)psVar3[uVar16];
            }
            bVar18 = *piVar13 == lVar6;
            bVar8 = ((hugeint_t *)(piVar13 + -1))->lower == uVar5;
            psVar4[iVar9] = (sel_t)uVar10;
            iVar9 = iVar9 + (bVar18 && bVar8);
            psVar7[lVar12] = (sel_t)uVar10;
            lVar12 = lVar12 + (ulong)(!bVar18 || !bVar8);
            uVar16 = uVar16 + 1;
            piVar13 = piVar13 + 2;
            uVar10 = uVar17;
          } while (uVar17 != uVar16);
        }
      }
      else {
        uVar2 = puVar1[uVar15];
        uVar17 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar17 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_014549f3;
        if (uVar2 == 0) {
          uVar10 = uVar17;
          if (uVar16 < uVar17) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar11 = (sel_t)uVar16;
              if (psVar3 != (sel_t *)0x0) {
                sVar11 = psVar3[uVar16];
              }
              psVar4[lVar12] = sVar11;
              lVar12 = lVar12 + 1;
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
        }
        else if (uVar16 < uVar17) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          piVar13 = &ldata[uVar16].upper;
          uVar14 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar11 = (int)uVar16 + (int)uVar14;
            }
            else {
              sVar11 = psVar3[uVar16 + uVar14];
            }
            if ((uVar2 >> (uVar14 & 0x3f) & 1) == 0) {
              bVar18 = false;
            }
            else {
              bVar18 = *piVar13 == rdata->upper &&
                       ((hugeint_t *)(piVar13 + -1))->lower == rdata->lower;
            }
            psVar4[iVar9] = sVar11;
            iVar9 = iVar9 + bVar18;
            psVar7[lVar12] = sVar11;
            lVar12 = lVar12 + (ulong)(bVar18 ^ 1);
            uVar14 = uVar14 + 1;
            piVar13 = piVar13 + 2;
            uVar10 = uVar17;
          } while (uVar17 - uVar16 != uVar14);
        }
      }
      uVar16 = uVar10;
      uVar15 = uVar15 + 1;
    } while (uVar15 != count + 0x3f >> 6);
  }
  return iVar9;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}